

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall llvm::detail::DoubleAPFloat::mod(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  opStatus oVar1;
  undefined1 local_a0 [32];
  DoubleAPFloat local_80;
  APFloat local_70;
  opStatus local_4c;
  undefined1 local_48 [4];
  opStatus Ret;
  undefined1 local_38 [8];
  APFloat Tmp;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._16_8_ = RHS;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x103d,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::mod(const DoubleAPFloat &)");
  }
  bitcastToAPInt((DoubleAPFloat *)local_48);
  APFloat::APFloat((APFloat *)local_38,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)local_48);
  APInt::~APInt((APInt *)local_48);
  bitcastToAPInt(&local_80);
  APFloat::APFloat(&local_70,(fltSemantics *)semPPCDoubleDoubleLegacy,(APInt *)&local_80);
  oVar1 = APFloat::mod((APFloat *)local_38,&local_70);
  APFloat::~APFloat(&local_70);
  APInt::~APInt((APInt *)&local_80);
  local_4c = oVar1;
  APFloat::bitcastToAPInt((APFloat *)local_a0);
  DoubleAPFloat((DoubleAPFloat *)(local_a0 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_a0);
  operator=(this,(DoubleAPFloat *)(local_a0 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_a0 + 0x10));
  APInt::~APInt((APInt *)local_a0);
  oVar1 = local_4c;
  APFloat::~APFloat((APFloat *)local_38);
  return oVar1;
}

Assistant:

APFloat::opStatus DoubleAPFloat::mod(const DoubleAPFloat &RHS) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy, bitcastToAPInt());
  auto Ret = Tmp.mod(APFloat(semPPCDoubleDoubleLegacy, RHS.bitcastToAPInt()));
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}